

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

int WI_DrawCharPatch(FFont *font,int charcode,int x,int y,EColorRange translation,bool nomove)

{
  DFrameBuffer *this;
  int iVar1;
  int tags_first;
  uint uVar2;
  undefined4 extraout_var;
  FRemapTable *pFVar3;
  double x_00;
  double y_00;
  int local_28;
  byte local_21;
  int width;
  int iStack_1c;
  bool nomove_local;
  EColorRange translation_local;
  int y_local;
  int x_local;
  int charcode_local;
  FFont *font_local;
  
  this = screen;
  local_21 = nomove;
  width = translation;
  iStack_1c = y;
  translation_local = x;
  y_local = charcode;
  _x_local = font;
  iVar1 = (*font->_vptr_FFont[2])(font,(ulong)(uint)charcode,&local_28);
  x_00 = (double)translation_local;
  y_00 = (double)iStack_1c;
  tags_first = 0x40001390;
  if ((local_21 & 1) != 0) {
    tags_first = 0x40001393;
  }
  uVar2 = 0x8000;
  if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    uVar2 = 0;
  }
  pFVar3 = FFont::GetColorTranslation(_x_local,width);
  DCanvas::DrawTexture
            ((DCanvas *)this,(FTexture *)CONCAT44(extraout_var,iVar1),x_00,y_00,tags_first,1,
             0x40001397,(ulong)uVar2,0x4000138e,pFVar3,0);
  return translation_local - local_28;
}

Assistant:

static int WI_DrawCharPatch (FFont *font, int charcode, int x, int y, EColorRange translation=CR_UNTRANSLATED, bool nomove=false)
{
	int width;
	screen->DrawTexture(font->GetChar(charcode, &width), x, y,
		nomove ? DTA_CleanNoMove : DTA_Clean, true,
		DTA_ShadowAlpha, (gameinfo.gametype & GAME_DoomChex) ? 0 : OPAQUE/2,
		DTA_Translation, font->GetColorTranslation(translation),
		TAG_DONE);
	return x - width;
}